

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSec.c
# Opt level: O1

void Fra_SecSetDefaultParams(Fra_Sec_t *p)

{
  p->nBddIterMax = 0;
  p->nPdrTimeout = 0;
  p->fPhaseAbstract = 0;
  p->fRetimeFirst = 0;
  p->fUseNewProver = 0;
  p->fUsePdr = 0;
  p->fSilent = 0;
  p->fVerbose = 0;
  p->fVeryVerbose = 0;
  p->TimeLimit = 0;
  p->fReadUnsolved = 0;
  p->nSMnumber = 0;
  p->fRecursive = 0;
  p->fReportSolution = 0;
  p->fTryComb = 1;
  p->fTryBmc = 1;
  p->nFramesMax = 4;
  p->nBTLimit = 1000;
  p->nBTLimitGlobal = 5000000;
  p->nBTLimitInter = 10000;
  p->nBddVarsMax = 0x96;
  p->nBddMax = 50000;
  p->nBddIterMax = 1000000;
  p->nPdrTimeout = 0x3c;
  p->fPhaseAbstract = 0;
  p->fRetimeFirst = 1;
  p->fRetimeRegs = 1;
  p->fFraiging = 1;
  p->fInduction = 1;
  p->fInterpolation = 1;
  p->fInterSeparate = 0;
  p->fReachability = 1;
  p->fReorderImage = 1;
  p->fStopOnFirstFail = 1;
  p->fUseNewProver = 0;
  p->fUsePdr = 1;
  p->fReportSolution = 0;
  p->fSilent = 0;
  p->fVerbose = 0;
  p->fVeryVerbose = 0;
  p->TimeLimit = 0;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Fra_SecSetDefaultParams( Fra_Sec_t * p )
{
    memset( p, 0, sizeof(Fra_Sec_t) );
    p->fTryComb          =       1;  // try CEC call as a preprocessing step
    p->fTryBmc           =       1;  // try BMC call as a preprocessing step 
    p->nFramesMax        =       4;  // the max number of frames used for induction
    p->nBTLimit          =    1000;  // conflict limit at a node during induction 
    p->nBTLimitGlobal    = 5000000;  // global conflict limit during induction
    p->nBTLimitInter     =   10000;  // conflict limit during interpolation
    p->nBddVarsMax       =     150;  // the limit on the number of registers in BDD reachability
    p->nBddMax           =   50000;  // the limit on the number of BDD nodes 
    p->nBddIterMax       = 1000000;  // the limit on the number of BDD iterations
    p->fPhaseAbstract    =       0;  // enables phase abstraction
    p->fRetimeFirst      =       1;  // enables most-forward retiming at the beginning
    p->fRetimeRegs       =       1;  // enables min-register retiming at the beginning
    p->fFraiging         =       1;  // enables fraiging at the beginning
    p->fInduction        =       1;  // enables the use of induction (signal correspondence)
    p->fInterpolation    =       1;  // enables interpolation
    p->fInterSeparate    =       0;  // enables interpolation for each outputs separately
    p->fReachability     =       1;  // enables BDD based reachability
    p->fReorderImage     =       1;  // enables variable reordering during image computation
    p->fStopOnFirstFail  =       1;  // enables stopping after first output of a miter has failed to prove
    p->fUseNewProver     =       0;  // enables new prover
    p->fUsePdr           =       1;  // enables PDR
    p->nPdrTimeout       =      60;  // enabled PDR timeout
    p->fSilent           =       0;  // disables all output
    p->fVerbose          =       0;  // enables verbose reporting of statistics
    p->fVeryVerbose      =       0;  // enables very verbose reporting  
    p->TimeLimit         =       0;  // enables the timeout
    // internal parameters
    p->fReportSolution   =       0;  // enables specialized format for reporting solution
}